

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O3

void __thiscall
Assimp::COBImporter::ReadBitM_Binary
          (COBImporter *this,Scene *param_1,StreamReaderLE *reader,ChunkInfo *nfo)

{
  uint uVar1;
  int iVar2;
  chunk_guard cn;
  chunk_guard local_20;
  
  if (1 < nfo->version) {
    UnsupportedChunk_Binary(this,reader,nfo,"BitM");
    return;
  }
  local_20.cur = (long)(*(int *)&reader->current - *(int *)&reader->buffer);
  local_20.nfo = nfo;
  local_20.reader = reader;
  uVar1 = StreamReader<false,_false>::Get<int>(reader);
  StreamReader<false,_false>::IncPtr(reader,(ulong)uVar1);
  StreamReader<false,_false>::Get<int>(reader);
  iVar2 = StreamReader<false,_false>::Get<int>(reader);
  StreamReader<false,_false>::IncPtr(reader,(long)iVar2);
  chunk_guard::~chunk_guard(&local_20);
  return;
}

Assistant:

void COBImporter::ReadBitM_Binary(COB::Scene& /*out*/, StreamReaderLE& reader, const ChunkInfo& nfo)
{
    if(nfo.version > 1) {
        return UnsupportedChunk_Binary(reader,nfo,"BitM");
    }

    const chunk_guard cn(nfo,reader);

    const uint32_t len = reader.GetI4();
    reader.IncPtr(len);

    reader.GetI4();
    reader.IncPtr(reader.GetI4());
}